

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

Bbl_Man_t * Bbl_ManStart(char *pName)

{
  Bbl_Man_t *__s;
  size_t sVar1;
  Vec_Str_t *pVVar2;
  Vec_Int_t *pVVar3;
  int local_28;
  int nLength;
  Bbl_Man_t *p;
  char *pName_local;
  
  __s = (Bbl_Man_t *)malloc(0x4d0);
  memset(__s,0,0x4d0);
  if (pName == (char *)0x0) {
    local_28 = 0;
  }
  else {
    sVar1 = strlen(pName);
    local_28 = ((int)(sVar1 + 1 >> 2) + 1) * 4;
  }
  pVVar2 = Vec_StrAlloc(local_28);
  __s->pName = pVVar2;
  __s->pName->nSize = __s->pName->nCap;
  if (pName != (char *)0x0) {
    strcpy(__s->pName->pArray,pName);
  }
  pVVar2 = Vec_StrAlloc(0x10000);
  __s->pObjs = pVVar2;
  pVVar2 = Vec_StrAlloc(0x10000);
  __s->pFncs = pVVar2;
  pVVar2 = Vec_StrAlloc(0x10000);
  __s->pEnts = pVVar2;
  __s->pEnts->nSize = 1;
  pVVar3 = Vec_IntStart(0x400);
  __s->vId2Obj = pVVar3;
  pVVar3 = Vec_IntStart(0x400);
  __s->vFaninNums = pVVar3;
  return __s;
}

Assistant:

Bbl_Man_t * Bbl_ManStart( char * pName )
{
    Bbl_Man_t * p;
    int nLength;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    nLength = pName? 4 * ((strlen(pName) + 1) / 4 + 1) : 0;
    p->pName  = Vec_StrAlloc( nLength );
    p->pName->nSize = p->pName->nCap;
    if ( pName )
        strcpy( p->pName->pArray, pName );
    p->pObjs = Vec_StrAlloc( 1 << 16 );
    p->pFncs = Vec_StrAlloc( 1 << 16 );
    p->pEnts = Vec_StrAlloc( 1 << 16 ); p->pEnts->nSize = 1;
    p->vId2Obj = Vec_IntStart( 1 << 10 );
    p->vFaninNums = Vec_IntStart( 1 << 10 );
    return p;
}